

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

bool flatbuffers::anon_unknown_101::VerifyUnion
               (Verifier *v,Schema *schema,uint8_t utype,uint8_t *elem,Field *union_field)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  char *__function;
  undefined7 in_register_00000011;
  Schema *pSVar5;
  Object *obj;
  Field *pFVar6;
  long lVar7;
  unsigned_short vtsize;
  unsigned_short vtsize_1;
  Schema *pSVar8;
  
  if ((int)CONCAT71(in_register_00000011,utype) == 0) {
    bVar2 = true;
  }
  else {
    lVar3 = -(long)*(int *)schema;
    if ((*(ushort *)(schema + -(long)*(int *)schema) < 7) ||
       (uVar4 = (ulong)*(ushort *)(schema + lVar3 + 6), uVar4 == 0)) {
      pSVar8 = (Schema *)0x0;
    }
    else {
      pSVar8 = schema + *(uint *)(schema + uVar4) + uVar4;
    }
    if ((*(ushort *)(union_field + -(long)*(int *)union_field) < 7) ||
       (uVar4 = (ulong)*(ushort *)(union_field + (6 - (long)*(int *)union_field)), uVar4 == 0)) {
      pFVar6 = (Field *)0x0;
    }
    else {
      pFVar6 = union_field + *(uint *)(union_field + uVar4) + uVar4;
    }
    if (((*(ushort *)(pFVar6 + -(long)*(int *)pFVar6) < 9) ||
        ((ulong)*(ushort *)(pFVar6 + (8 - (long)*(int *)pFVar6)) == 0)) ||
       (*(uint *)pSVar8 <= *(uint *)(pFVar6 + *(ushort *)(pFVar6 + (8 - (long)*(int *)pFVar6))))) {
      __function = 
      "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Enum>, SizeT = unsigned int]"
      ;
LAB_0014ed7c:
      __assert_fail("i < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                    ,0xc1,__function);
    }
    uVar4 = (ulong)(*(uint *)(pFVar6 + *(ushort *)(pFVar6 + (8 - (long)*(int *)pFVar6))) << 2);
    lVar7 = *(uint *)(pSVar8 + uVar4 + 4) + uVar4 + 4;
    lVar1 = (ulong)*(ushort *)
                    (pSVar8 + (lVar7 - *(int *)(pSVar8 + (ulong)*(uint *)(pSVar8 + uVar4 + 4) + 4 +
                                                         uVar4)) + 6) + lVar7;
    if ((uint)utype <
        *(uint *)(pSVar8 + (ulong)*(uint *)(pSVar8 + (ulong)*(ushort *)
                                                             (pSVar8 + (lVar7 - *(int *)(pSVar8 + (
                                                  ulong)*(uint *)(pSVar8 + uVar4 + 4) + 4 + uVar4))
                                                  + 6) + lVar7) + lVar1)) {
      lVar1 = (ulong)*(uint *)(pSVar8 + (ulong)*(ushort *)
                                                (pSVar8 + (lVar7 - *(int *)(pSVar8 + (ulong)*(uint *
                                                  )(pSVar8 + uVar4 + 4) + 4 + uVar4)) + 6) + lVar7)
              + lVar1;
      lVar7 = (ulong)*(uint *)(pSVar8 + (ulong)utype * 4 + lVar1 + 4) + (ulong)utype * 4 + lVar1;
      pSVar5 = pSVar8 + lVar7 + 4;
      if ((*(ushort *)(pSVar5 + -(long)*(int *)pSVar5) < 0xb) ||
         (uVar4 = (ulong)*(ushort *)(pSVar8 + ((lVar7 + 0xe) - (long)*(int *)pSVar5)), uVar4 == 0))
      {
        pSVar5 = (Schema *)0x0;
      }
      else {
        pSVar5 = pSVar5 + *(uint *)(pSVar5 + uVar4) + uVar4;
      }
      if (4 < *(ushort *)(pSVar5 + -(long)*(int *)pSVar5)) {
        lVar7 = -(long)*(int *)pSVar5;
        if ((ulong)*(ushort *)(pSVar5 + lVar7 + 4) != 0) {
          if (pSVar5[*(ushort *)(pSVar5 + lVar7 + 4)].super_Table == (Table)0xd) {
            bVar2 = VerifierTemplate<false>::VerifyString(v,(String *)elem);
            return bVar2;
          }
          if (pSVar5[*(ushort *)(pSVar5 + lVar7 + 4)].super_Table == (Table)0xf) {
            if ((*(ushort *)(schema + -(long)*(int *)schema) < 5) ||
               (uVar4 = (ulong)*(ushort *)(schema + lVar3 + 4), uVar4 == 0)) {
              pSVar8 = (Schema *)0x0;
            }
            else {
              pSVar8 = schema + *(uint *)(schema + uVar4) + uVar4;
            }
            if (((8 < *(ushort *)(pSVar5 + -(long)*(int *)pSVar5)) &&
                ((ulong)*(ushort *)(pSVar5 + lVar7 + 8) != 0)) &&
               (*(uint *)(pSVar5 + *(ushort *)(pSVar5 + lVar7 + 8)) < *(uint *)pSVar8)) {
              uVar4 = (ulong)(*(uint *)(pSVar5 + *(ushort *)(pSVar5 + lVar7 + 8)) << 2);
              lVar3 = *(uint *)(pSVar8 + uVar4 + 4) + uVar4;
              obj = (Object *)(pSVar8 + lVar3 + 4);
              if (8 < *(ushort *)(obj + -(long)*(int *)obj)) {
                lVar7 = -(long)*(int *)obj;
                if (((ulong)*(ushort *)(pSVar8 + lVar7 + lVar3 + 0xc) != 0) &&
                   (obj[*(ushort *)(pSVar8 + lVar7 + lVar3 + 0xc)].super_Table != (Table)0x0)) {
                  if ((*(ushort *)(obj + -(long)*(int *)obj) < 0xd) ||
                     ((ulong)*(ushort *)(pSVar8 + lVar7 + lVar3 + 0x10) == 0)) {
                    uVar4 = 0;
                  }
                  else {
                    uVar4 = (ulong)*(int *)(obj + *(ushort *)(pSVar8 + lVar7 + lVar3 + 0x10));
                  }
                  return (ulong)((long)elem - (long)v->buf_) <= v->size_ - uVar4 && uVar4 < v->size_
                  ;
                }
              }
              bVar2 = VerifyObject(v,schema,obj,(Table *)elem,true);
              return bVar2;
            }
            __function = 
            "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
            ;
            goto LAB_0014ed7c;
          }
        }
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool VerifyUnion(flatbuffers::Verifier &v,
                        const reflection::Schema &schema, uint8_t utype,
                        const uint8_t *elem,
                        const reflection::Field &union_field) {
  if (!utype) return true;  // Not present.
  auto fb_enum = schema.enums()->Get(union_field.type()->index());
  if (utype >= fb_enum->values()->size()) return false;
  auto elem_type = fb_enum->values()->Get(utype)->union_type();
  switch (elem_type->base_type()) {
    case reflection::Obj: {
      auto elem_obj = schema.objects()->Get(elem_type->index());
      if (elem_obj->is_struct()) {
        return v.VerifyFromPointer(elem, elem_obj->bytesize());
      } else {
        return VerifyObject(v, schema, *elem_obj,
                            reinterpret_cast<const flatbuffers::Table *>(elem),
                            true);
      }
    }
    case reflection::String:
      return v.VerifyString(
          reinterpret_cast<const flatbuffers::String *>(elem));
    default: return false;
  }
}